

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

var __thiscall cs::function::call_vv(function *this,function *_this,vector *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  stack_pointer psVar3;
  _Elt_pointer ppsVar4;
  statement_base *psVar5;
  undefined *puVar6;
  function *pfVar7;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this_00;
  var *pvVar8;
  element_type *peVar9;
  ulong uVar10;
  _Map_pointer pppsVar11;
  _Elt_pointer ppsVar12;
  char *name;
  pointer paVar13;
  stack_pointer this_01;
  ulong uVar14;
  _Elt_pointer ppsVar15;
  fcall_guard fcall;
  var arg_list;
  scope_guard scope;
  fcall_guard local_a9;
  any local_a8;
  function *local_a0;
  scope_guard local_98 [13];
  
  puVar6 = current_process;
  if ((*current_process & 1) != 0) {
    LOCK();
    *current_process = 0;
    UNLOCK();
    event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
  }
  peVar2 = (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  psVar3 = *(peVar2->super_runtime_type).storage.fiber_stack;
  this_01 = &(peVar2->super_runtime_type).storage.m_data;
  if (psVar3 != (stack_pointer)0x0) {
    this_01 = psVar3;
  }
  local_98[0].context = &_this->mContext;
  stack_type<cs::domain_type,_std::allocator>::push<>(this_01);
  stack_type<cs_impl::any,std::allocator>::push<cs::pointer_const&>
            ((stack_type<cs_impl::any,std::allocator> *)(current_process + 0x80),
             (pointer *)&null_pointer);
  cs_impl::any::make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>();
  this_00 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(&local_a8);
  local_a0 = this;
  if (_this->mIsMemFn == true) {
    name = "this";
  }
  else {
    if (_this->mIsLambda == false) {
      uVar10 = 0;
      goto LAB_001d4827;
    }
    name = "self";
  }
  uVar10 = 1;
  domain_manager::add_var_no_return<char_const(&)[5]>
            (&(((((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->instance).
                super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_runtime_type).storage,(char (*) [5])name,
             (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Vector_impl_data._M_start);
LAB_001d4827:
  paVar13 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar10 < (ulong)((long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)
                             ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 3)) {
    uVar14 = (ulong)(uint)((int)uVar10 * 8);
    do {
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                (this_00,(value_type *)((long)&paVar13->mDat + uVar14));
      uVar10 = uVar10 + 1;
      paVar13 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar14 = uVar14 + 8;
    } while (uVar10 < (ulong)((long)(args->
                                    super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar13 >> 3)
            );
  }
  domain_manager::add_var_no_return<std::__cxx11::string_const&>
            (&(((((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->instance).
                super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_runtime_type).storage,
             (_this->mArgs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_a8);
  cs_impl::any::recycle(&local_a8);
  ppsVar12 = (_this->mBody).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  ppsVar4 = (_this->mBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar12 != ppsVar4) {
    ppsVar15 = (_this->mBody).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
    pppsVar11 = (_this->mBody).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      puVar6 = current_process;
      psVar5 = *ppsVar12;
      if ((*current_process & 1) != 0) {
        LOCK();
        *current_process = 0;
        UNLOCK();
        event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
      }
      (*psVar5->_vptr_statement_base[3])(psVar5);
      peVar2 = (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (peVar2->return_fcall == true) {
        peVar2->return_fcall = false;
        pvVar8 = fcall_guard::get(&local_a9);
        goto LAB_001d4918;
      }
      ppsVar12 = ppsVar12 + 1;
      if (ppsVar12 == ppsVar15) {
        ppsVar12 = pppsVar11[1];
        pppsVar11 = pppsVar11 + 1;
        ppsVar15 = ppsVar12 + 0x40;
      }
    } while (ppsVar12 != ppsVar4);
  }
  pvVar8 = fcall_guard::get(&local_a9);
LAB_001d4918:
  pfVar7 = local_a0;
  peVar9 = (element_type *)pvVar8->mDat;
  if (peVar9 == (element_type *)0x0) {
    peVar9 = (element_type *)0x0;
  }
  else {
    p_Var1 = &(peVar9->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    p_Var1->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&p_Var1->_M_pi->_vptr__Sp_counted_base + 1);
  }
  (local_a0->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar9;
  fcall_guard::~fcall_guard(&local_a9);
  scope_guard::~scope_guard(local_98);
  return (var)(proxy *)pfVar7;
}

Assistant:

var function::call_vv(const function *_this, vector &args)
	{
		current_process->poll_event();
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#else
		fcall_guard fcall;
#endif
		{
			var arg_list = var::make<cs::array>();
			auto &arr = arg_list.val<cs::array>();
			std::size_t i = 0;
			if (_this->mIsMemFn)
				_this->mContext->instance->storage.add_var_no_return("this", args[i++]);
			else if (_this->mIsLambda)
				_this->mContext->instance->storage.add_var_no_return("self", args[i++]);
			for (; i < args.size(); ++i)
				arr.push_back(args[i]);
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs.front(), arg_list);
		}
		for (auto &ptr: _this->mBody) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
			if (_this->mContext->instance->return_fcall) {
				_this->mContext->instance->return_fcall = false;
				return fcall.get();
			}
		}
		return fcall.get();
	}